

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O0

Expression * __thiscall
wasm::ParamInfo::lowerToExpression(ParamInfo *this,Builder *builder,Module *module,size_t index)

{
  string_view func;
  Module *this_00;
  Literal *other;
  add_pointer_t<const_std::vector<wasm::Name>_> this_01;
  string_view *psVar1;
  Function *pFVar2;
  HeapType heapType;
  value_type fnName;
  add_pointer_t<const_std::vector<wasm::Name>_> callees;
  Literal local_50;
  SmallVector<wasm::Literal,_1UL> *local_38;
  add_pointer_t<const_wasm::Literals> literals;
  size_t index_local;
  Module *module_local;
  Builder *builder_local;
  ParamInfo *this_local;
  
  literals = (add_pointer_t<const_wasm::Literals>)index;
  index_local = (size_t)module;
  module_local = (Module *)builder;
  builder_local = (Builder *)this;
  local_38 = &std::
              get_if<wasm::Literals,wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>
                        (&this->values)->super_SmallVector<wasm::Literal,_1UL>;
  this_00 = module_local;
  if (local_38 == (SmallVector<wasm::Literal,_1UL> *)0x0) {
    this_01 = std::
              get_if<std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>
                        (&this->values);
    if (this_01 == (add_pointer_t<const_std::vector<wasm::Name>_>)0x0) {
      handle_unreachable("unexpected const value type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                         ,0x8a);
    }
    psVar1 = (string_view *)
             std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                       (this_01,(size_type)literals);
    func = *psVar1;
    pFVar2 = Module::getFunction((Module *)index_local,(Name)*psVar1);
    this_local = (ParamInfo *)
                 Builder::makeRefFunc
                           ((Builder *)module_local,(Name)func,(HeapType)(pFVar2->type).id);
  }
  else {
    other = SmallVector<wasm::Literal,_1UL>::operator[](local_38,(size_t)literals);
    wasm::Literal::Literal(&local_50,other);
    this_local = (ParamInfo *)Builder::makeConst((Builder *)this_00,&local_50);
    wasm::Literal::~Literal(&local_50);
  }
  return (Expression *)this_local;
}

Assistant:

Expression*
  lowerToExpression(Builder& builder, Module* module, size_t index) const {
    if (const auto literals = std::get_if<Literals>(&values)) {
      return builder.makeConst((*literals)[index]);
    } else if (auto callees = std::get_if<std::vector<Name>>(&values)) {
      auto fnName = (*callees)[index];
      auto heapType = module->getFunction(fnName)->type;
      return builder.makeRefFunc(fnName, heapType);
    } else {
      WASM_UNREACHABLE("unexpected const value type");
    }
  }